

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderTGA.cpp
# Opt level: O0

IImage * __thiscall irr::video::CImageLoaderTGA::loadImage(CImageLoaderTGA *this,IReadFile *file)

{
  bool bVar1;
  ulong uVar2;
  u8 *puVar3;
  IImage *pIVar4;
  long *in_RSI;
  double dVar5;
  IImage *image;
  s32 imageSize;
  u8 *data;
  u8 *colorMap;
  u16 i;
  u32 errorCol;
  u16 paletteSize;
  u32 *palette;
  STGAHeader header;
  undefined4 in_stack_fffffffffffffe88;
  s32 in_stack_fffffffffffffe8c;
  s32 in_stack_fffffffffffffe90;
  undefined1 uVar6;
  s32 in_stack_fffffffffffffe94;
  s32 *in_stack_fffffffffffffe98;
  ECOLOR_FORMAT EVar7;
  CImage *in_stack_fffffffffffffea0;
  s16 *in_stack_fffffffffffffea8;
  STGAHeader *in_stack_fffffffffffffeb0;
  IReadFile *in_stack_fffffffffffffeb8;
  u8 *puVar8;
  CImageLoaderTGA *in_stack_fffffffffffffec0;
  ushort local_d2;
  uint local_c8;
  uint local_c4;
  dimension2d<unsigned_int> local_c0;
  uint local_b8;
  uint local_b4;
  dimension2d<unsigned_int> local_b0;
  uint local_a8;
  uint local_a4;
  dimension2d<unsigned_int> local_a0;
  uint local_98;
  uint local_94;
  dimension2d<unsigned_int> local_90;
  uint local_88;
  uint local_84;
  dimension2d<unsigned_int> local_80;
  uint local_78;
  uint local_74;
  dimension2d<unsigned_int> local_70;
  IImage *local_68;
  int local_5c;
  u8 *local_58;
  void *local_50;
  ushort local_42;
  undefined4 local_40;
  ushort local_3a;
  u8 *local_38;
  char local_2a;
  char local_29;
  char local_28;
  ushort local_25;
  byte local_23;
  ushort local_1e;
  ushort local_1c;
  byte local_1a;
  byte local_19;
  long *local_18;
  IImage *local_8;
  
  uVar6 = (undefined1)((uint)in_stack_fffffffffffffe88 >> 0x18);
  local_38 = (u8 *)0x0;
  local_18 = in_RSI;
  (**(code **)*in_RSI)(in_RSI,&local_2a,0x12);
  bVar1 = checkImageDimensions((uint)local_1e,(uint)local_1c);
  if (bVar1) {
    if (local_2a != '\0') {
      (**(code **)(*local_18 + 8))(local_18,local_2a,1);
    }
    if (local_29 != '\0') {
      if (local_25 < 0x100) {
        local_d2 = 0x100;
      }
      else {
        local_d2 = local_25;
      }
      local_3a = local_d2;
      uVar2 = SUB168(ZEXT216(local_d2) * ZEXT816(4),0);
      if (SUB168(ZEXT216(local_d2) * ZEXT816(4),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      local_38 = (u8 *)operator_new__(uVar2);
      if (local_25 < local_3a) {
        local_40 = 0xffff00cd;
        for (local_42 = local_25; local_42 < local_3a; local_42 = local_42 + 1) {
          puVar8 = local_38 + (ulong)local_42 * 4;
          puVar8[0] = 0xcd;
          puVar8[1] = '\0';
          puVar8[2] = 0xff;
          puVar8[3] = 0xff;
        }
      }
      local_50 = operator_new__((ulong)((uint)(local_23 >> 3) * (uint)local_25));
      (**(code **)*local_18)(local_18,local_50,(uint)(local_23 >> 3) * (uint)local_25);
      if (local_23 == 0x10) {
        CColorConverter::convert_A1R5G5B5toA8R8G8B8
                  (in_stack_fffffffffffffeb0,(s32)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                   in_stack_fffffffffffffea0);
      }
      else if (local_23 == 0x18) {
        CColorConverter::convert_B8G8R8toA8R8G8B8(local_50,(uint)local_25,local_38);
      }
      else if (local_23 == 0x20) {
        CColorConverter::convert_B8G8R8A8toA8R8G8B8(local_50,(uint)local_25,local_38);
      }
      if (local_50 != (void *)0x0) {
        operator_delete__(local_50);
      }
    }
    local_58 = (u8 *)0x0;
    if (((local_28 == '\x01') || (local_28 == '\x02')) || (local_28 == '\x03')) {
      local_5c = (uint)local_1c * (uint)local_1e * (local_1a / 8);
      local_58 = (u8 *)operator_new__((long)local_5c);
      (**(code **)*local_18)(local_18,local_58,(long)local_5c);
    }
    else {
      if (local_28 != '\n') {
        dVar5 = (double)(**(code **)(*local_18 + 0x20))();
        os::Printer::log(dVar5);
        if (local_38 != (u8 *)0x0) {
          operator_delete__(local_38);
        }
        return (IImage *)0x0;
      }
      local_58 = loadCompressedImage(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                     in_stack_fffffffffffffeb0);
    }
    local_68 = (IImage *)0x0;
    switch(local_1a) {
    case 8:
      if (local_28 == '\x03') {
        pIVar4 = (IImage *)operator_new(0x50);
        EVar7 = (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffe98 >> 0x20);
        local_74 = (uint)local_1e;
        local_78 = (uint)local_1c;
        core::dimension2d<unsigned_int>::dimension2d(&local_70,&local_74,&local_78);
        CImage::CImage(in_stack_fffffffffffffea0,EVar7,
                       (dimension2d<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        puVar8 = local_58;
        local_68 = pIVar4;
        if (pIVar4 != (IImage *)0x0) {
          puVar3 = (u8 *)IImage::getData(pIVar4);
          CColorConverter::convert8BitTo24Bit
                    (puVar8,puVar3,(uint)local_1e,(uint)local_1c,(u8 *)0x0,0,(local_19 & 0x20) == 0)
          ;
        }
      }
      else if (local_23 == 0x10) {
        pIVar4 = (IImage *)operator_new(0x50);
        local_84 = (uint)local_1e;
        local_88 = (uint)local_1c;
        core::dimension2d<unsigned_int>::dimension2d(&local_80,&local_84,&local_88);
        CImage::CImage(in_stack_fffffffffffffea0,
                       (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                       (dimension2d<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        uVar6 = (undefined1)((uint)in_stack_fffffffffffffe90 >> 0x18);
        local_68 = pIVar4;
        if (pIVar4 != (IImage *)0x0) {
          IImage::getData(pIVar4);
          CColorConverter::convert8BitTo16Bit
                    (&in_stack_fffffffffffffeb0->IdLength,in_stack_fffffffffffffea8,
                     (s32)((ulong)in_stack_fffffffffffffea0 >> 0x20),(s32)in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,(bool)uVar6);
        }
      }
      else {
        pIVar4 = (IImage *)operator_new(0x50);
        EVar7 = (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffe98 >> 0x20);
        local_94 = (uint)local_1e;
        local_98 = (uint)local_1c;
        core::dimension2d<unsigned_int>::dimension2d(&local_90,&local_94,&local_98);
        CImage::CImage(in_stack_fffffffffffffea0,EVar7,
                       (dimension2d<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        puVar8 = local_58;
        local_68 = pIVar4;
        if (pIVar4 != (IImage *)0x0) {
          puVar3 = (u8 *)IImage::getData(pIVar4);
          CColorConverter::convert8BitTo32Bit
                    (puVar8,puVar3,(uint)local_1e,(uint)local_1c,local_38,0,(local_19 & 0x20) == 0);
        }
      }
      break;
    default:
      dVar5 = (double)(**(code **)(*local_18 + 0x20))();
      os::Printer::log(dVar5);
      break;
    case 0x10:
      pIVar4 = (IImage *)operator_new(0x50);
      local_a4 = (uint)local_1e;
      local_a8 = (uint)local_1c;
      core::dimension2d<unsigned_int>::dimension2d(&local_a0,&local_a4,&local_a8);
      CImage::CImage(in_stack_fffffffffffffea0,
                     (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                     (dimension2d<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      local_68 = pIVar4;
      if (pIVar4 != (IImage *)0x0) {
        IImage::getData(pIVar4);
        CColorConverter::convert16BitTo16Bit
                  ((s16 *)in_stack_fffffffffffffea0,(s16 *)in_stack_fffffffffffffe98,
                   in_stack_fffffffffffffe94,in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                   (bool)uVar6);
      }
      break;
    case 0x18:
      pIVar4 = (IImage *)operator_new(0x50);
      EVar7 = (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      local_b4 = (uint)local_1e;
      local_b8 = (uint)local_1c;
      core::dimension2d<unsigned_int>::dimension2d(&local_b0,&local_b4,&local_b8);
      CImage::CImage(in_stack_fffffffffffffea0,EVar7,
                     (dimension2d<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      local_68 = pIVar4;
      if (pIVar4 != (IImage *)0x0) {
        puVar8 = local_58;
        IImage::getData(pIVar4);
        CColorConverter::convert24BitTo24Bit
                  ((u8 *)pIVar4,puVar8,(s32)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   (s32)in_stack_fffffffffffffeb0,(s32)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0),
                   SUB81((ulong)in_stack_fffffffffffffea8 >> 0x10,0));
      }
      break;
    case 0x20:
      pIVar4 = (IImage *)operator_new(0x50);
      local_c4 = (uint)local_1e;
      local_c8 = (uint)local_1c;
      core::dimension2d<unsigned_int>::dimension2d(&local_c0,&local_c4,&local_c8);
      CImage::CImage(in_stack_fffffffffffffea0,
                     (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                     (dimension2d<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      local_68 = pIVar4;
      if (pIVar4 != (IImage *)0x0) {
        IImage::getData(pIVar4);
        CColorConverter::convert32BitTo32Bit
                  ((s32 *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   in_stack_fffffffffffffe94,in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                   (bool)uVar6);
      }
    }
    if (local_58 != (u8 *)0x0) {
      operator_delete__(local_58);
    }
    if (local_38 != (u8 *)0x0) {
      operator_delete__(local_38);
    }
    local_8 = local_68;
  }
  else {
    dVar5 = (double)(**(code **)(*local_18 + 0x20))();
    os::Printer::log(dVar5);
    local_8 = (IImage *)0x0;
  }
  return local_8;
}

Assistant:

IImage *CImageLoaderTGA::loadImage(io::IReadFile *file) const
{
	STGAHeader header;
	u32 *palette = 0;

	file->read(&header, sizeof(STGAHeader));

#ifdef __BIG_ENDIAN__
	header.ColorMapLength = os::Byteswap::byteswap(header.ColorMapLength);
	header.ImageWidth = os::Byteswap::byteswap(header.ImageWidth);
	header.ImageHeight = os::Byteswap::byteswap(header.ImageHeight);
#endif

	if (!checkImageDimensions(header.ImageWidth, header.ImageHeight)) {
		os::Printer::log("Image dimensions too large in file", file->getFileName(), ELL_ERROR);
		return 0;
	}

	// skip image identification field
	if (header.IdLength)
		file->seek(header.IdLength, true);

	if (header.ColorMapType) {
		// Create 32 bit palette
		// `core::max_()` is not used here because it takes its inputs as references. Since `header` is packed, use the macro `MAX()` instead:
		const irr::u16 paletteSize = MAX((u16)256u, header.ColorMapLength); // ColorMapLength can lie, but so far we only use palette for 8-bit, so ensure it has 256 entries
		palette = new u32[paletteSize];

		if (paletteSize > header.ColorMapLength) {
			// To catch images using palette colors with invalid indices
			const irr::u32 errorCol = irr::video::SColor(255, 255, 0, 205).color; // bright magenta
			for (irr::u16 i = header.ColorMapLength; i < paletteSize; ++i)
				palette[i] = errorCol;
		}

		// read color map
		u8 *colorMap = new u8[header.ColorMapEntrySize / 8 * header.ColorMapLength];
		file->read(colorMap, header.ColorMapEntrySize / 8 * header.ColorMapLength);

		// convert to 32-bit palette
		switch (header.ColorMapEntrySize) {
		case 16:
			CColorConverter::convert_A1R5G5B5toA8R8G8B8(colorMap, header.ColorMapLength, palette);
			break;
		case 24:
			CColorConverter::convert_B8G8R8toA8R8G8B8(colorMap, header.ColorMapLength, palette);
			break;
		case 32:
			CColorConverter::convert_B8G8R8A8toA8R8G8B8(colorMap, header.ColorMapLength, palette);
			break;
		}
		delete[] colorMap;
	}

	// read image

	u8 *data = 0;

	if (header.ImageType == 1 ||     // Uncompressed, color-mapped images.
			header.ImageType == 2 || // Uncompressed, RGB images
			header.ImageType == 3    // Uncompressed, black and white images
	) {
		const s32 imageSize = header.ImageHeight * header.ImageWidth * (header.PixelDepth / 8);
		data = new u8[imageSize];
		file->read(data, imageSize);
	} else if (header.ImageType == 10) {
		// Runlength encoded RGB images
		data = loadCompressedImage(file, header);
	} else {
		os::Printer::log("Unsupported TGA file type", file->getFileName(), ELL_ERROR);
		delete[] palette;
		return 0;
	}

	IImage *image = 0;

	switch (header.PixelDepth) {
	case 8: {
		if (header.ImageType == 3) { // grey image
			image = new CImage(ECF_R8G8B8,
					core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
			if (image)
				CColorConverter::convert8BitTo24Bit((u8 *)data,
						(u8 *)image->getData(),
						header.ImageWidth, header.ImageHeight,
						0, 0, (header.ImageDescriptor & 0x20) == 0);
		} else {
			switch (header.ColorMapEntrySize) {
			case 16:
				image = new CImage(ECF_A1R5G5B5, core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
				if (image)
					CColorConverter::convert8BitTo16Bit((u8 *)data,
							(s16 *)image->getData(),
							header.ImageWidth, header.ImageHeight,
							(s32 *)palette, 0,
							(header.ImageDescriptor & 0x20) == 0);
				break;
			// Note: 24 bit with palette would need a 24 bit palette, too lazy doing that now (textures will prefer 32-bit later anyway)
			default:
				image = new CImage(ECF_A8R8G8B8, core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
				if (image)
					CColorConverter::convert8BitTo32Bit((u8 *)data,
							(u8 *)image->getData(),
							header.ImageWidth, header.ImageHeight,
							(u8 *)palette, 0,
							(header.ImageDescriptor & 0x20) == 0);
				break;
			}
		}
	} break;
	case 16:
		image = new CImage(ECF_A1R5G5B5,
				core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
		if (image)
			CColorConverter::convert16BitTo16Bit((s16 *)data,
					(s16 *)image->getData(), header.ImageWidth, header.ImageHeight, 0, (header.ImageDescriptor & 0x20) == 0);
		break;
	case 24:
		image = new CImage(ECF_R8G8B8,
				core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
		if (image)
			CColorConverter::convert24BitTo24Bit(
					(u8 *)data, (u8 *)image->getData(), header.ImageWidth, header.ImageHeight, 0, (header.ImageDescriptor & 0x20) == 0, true);
		break;
	case 32:
		image = new CImage(ECF_A8R8G8B8,
				core::dimension2d<u32>(header.ImageWidth, header.ImageHeight));
		if (image)
			CColorConverter::convert32BitTo32Bit((s32 *)data,
					(s32 *)image->getData(), header.ImageWidth, header.ImageHeight, 0, (header.ImageDescriptor & 0x20) == 0);
		break;
	default:
		os::Printer::log("Unsupported TGA format", file->getFileName(), ELL_ERROR);
		break;
	}

	delete[] data;
	delete[] palette;

	return image;
}